

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O2

int CascLoadEncryptionKeys(TCascStorage *hs)

{
  int iVar1;
  PCASC_MAP p_Var2;
  long lVar3;
  
  p_Var2 = Map_Create(0xf6,8,0);
  hs->pEncryptionKeys = p_Var2;
  if (p_Var2 != (PCASC_MAP)0x0) {
    for (lVar3 = 0; lVar3 != 0xb10; lVar3 = lVar3 + 0x18) {
      Map_InsertObject(hs->pEncryptionKeys,CascKeys[0].Key + lVar3 + -8,CascKeys[0].Key + lVar3 + -8
                      );
    }
    iVar1 = CASC_ARRAY::Create<_CASC_ENCRYPTION_KEY>(&hs->ExtraKeysList,0x80);
    return iVar1;
  }
  return 0xc;
}

Assistant:

int CascLoadEncryptionKeys(TCascStorage * hs)
{
    size_t nKeyCount = (sizeof(CascKeys) / sizeof(CASC_ENCRYPTION_KEY));
    size_t nMaxItems = nKeyCount + CASC_EXTRA_KEYS;
    int nError;

    // Create fast map of KeyName -> Key
    hs->pEncryptionKeys = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_ENCRYPTION_KEY, KeyName));
    if (hs->pEncryptionKeys == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Insert all static keys
    for (size_t i = 0; i < nKeyCount; i++)
        Map_InsertObject(hs->pEncryptionKeys, &CascKeys[i], &CascKeys[i].KeyName);

    // Create array for extra keys
    nError = hs->ExtraKeysList.Create<CASC_ENCRYPTION_KEY>(CASC_EXTRA_KEYS);
    return nError;
}